

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O2

string * util::fs::join_path(string *__return_storage_ptr__,string *path1,string *path2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  undefined1 local_40 [8];
  string p2;
  
  sanitize_path((string *)local_40,path2);
  if ((p2._M_dataplus._M_p == (pointer)0x0) || (*(char *)local_40 != '/')) {
    sanitize_path(&local_60,path1);
    std::operator+(&local_80,&local_60,'/');
    std::operator+(__return_storage_ptr__,&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_40 == (undefined1  [8])&p2._M_string_length) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(p2._M_string_length._1_7_,(undefined1)p2._M_string_length);
      *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) = p2.field_2._M_allocated_capacity;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(p2._M_string_length._1_7_,(undefined1)p2._M_string_length);
    }
    __return_storage_ptr__->_M_string_length = (size_type)p2._M_dataplus._M_p;
    p2._M_dataplus._M_p = (pointer)0x0;
    p2._M_string_length._0_1_ = 0;
    local_40 = (undefined1  [8])&p2._M_string_length;
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string
join_path (std::string const& path1, std::string const& path2)
{
    std::string p2 = sanitize_path(path2);
    if (is_absolute(p2))
        return p2;

#ifdef _WIN32
    if (!p2.empty() && p2[0] == '/')
        return sanitize_path(path1) + p2;
#endif

    return sanitize_path(path1) + '/' + p2;
}